

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_http_cb(void *arg)

{
  nni_aio *aio;
  nni_ws *ws;
  void *arg_local;
  
  if ((*(byte *)((long)arg + 0x50) & 1) == 0) {
    ws_http_cb_dialer((nni_ws *)arg,(nni_aio *)((long)arg + 0x650));
  }
  else {
    ws_http_cb_listener((nni_ws *)arg,(nni_aio *)((long)arg + 0x650));
  }
  return;
}

Assistant:

static void
ws_http_cb(void *arg)
{
	nni_ws  *ws  = arg;
	nni_aio *aio = &ws->httpaio;

	if (ws->server) {
		ws_http_cb_listener(ws, aio);
	} else {
		ws_http_cb_dialer(ws, aio);
	}
}